

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int client_handle_hello(ptls_t *tls,ptls_message_emitter_t *emitter,ptls_iovec_t message,
                       ptls_handshake_properties_t *properties)

{
  ptls_iovec_t message_00;
  ptls_iovec_t ikm;
  int iVar1;
  void *pvVar2;
  size_t in_RDX;
  ptls_key_schedule_t *in_RSI;
  long *in_RDI;
  int ret;
  ptls_iovec_t ecdh_secret;
  st_ptls_server_hello_t sh;
  uint8_t *in_stack_000000d8;
  uint8_t *in_stack_000000e0;
  st_ptls_server_hello_t *in_stack_000000e8;
  ptls_t *in_stack_000000f0;
  size_t msglen;
  uint in_stack_ffffffffffffff68;
  uint uVar3;
  ptls_key_schedule_t *in_stack_ffffffffffffff70;
  size_t local_88;
  int in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  ptls_key_schedule_t *in_stack_ffffffffffffff90;
  ptls_message_emitter_t *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  ptls_t *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  long local_48;
  undefined8 local_40;
  int local_4;
  
  memset(&stack0xffffffffffffff70,0,0x10);
  local_4 = decode_server_hello(in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,
                                in_stack_000000d8);
  if (local_4 != 0) goto LAB_001199e2;
  if ((in_stack_ffffffffffffffa8 != (ptls_t *)in_RDI[0x2e]) ||
     (iVar1 = (*ptls_mem_equal)((void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0
                                                ),(void *)in_RDI[0x2d],in_RDI[0x2e]), iVar1 == 0)) {
    local_4 = 0x2f;
    goto LAB_001199e2;
  }
  if (in_stack_ffffffffffffffb0 != 0) {
    local_4 = key_schedule_select_one
                        (in_stack_ffffffffffffff90,
                         (ptls_cipher_suite_t *)
                         CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                         in_stack_ffffffffffffff84);
    if (local_4 == 0) {
      message_00.len._0_4_ = in_stack_ffffffffffffffb0;
      message_00.base = (uint8_t *)in_stack_ffffffffffffffa8;
      message_00.len._4_4_ = in_stack_ffffffffffffffb4;
      iVar1 = handle_hello_retry_request
                        ((ptls_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         in_stack_ffffffffffffff98,
                         (st_ptls_server_hello_t *)in_stack_ffffffffffffff90,message_00,
                         (ptls_handshake_properties_t *)
                         CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      return iVar1;
    }
    goto LAB_001199e2;
  }
  msglen = in_RDI[0x24];
  uVar3 = in_stack_ffffffffffffff68 & 0xffffff;
  if ((*(byte *)(in_RDI + 0x34) & 1) != 0) {
    uVar3 = CONCAT13((*(byte *)(in_RDI + 0x2c) >> 1 & 1) != 0,(int3)in_stack_ffffffffffffff68) ^
            0xff000000;
  }
  local_4 = key_schedule_select_one
                      (in_stack_ffffffffffffff90,
                       (ptls_cipher_suite_t *)
                       CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                       in_stack_ffffffffffffff84);
  if ((local_4 != 0) ||
     ((local_48 != 0 &&
      (local_4 = (**(code **)(in_RDI[0x33] + 0x18))
                           (in_RDI + 0x33,1,&stack0xffffffffffffff70,local_48,local_40),
      local_4 != 0)))) goto LAB_001199e2;
  ptls__key_schedule_update_hash(in_stack_ffffffffffffff70,(uint8_t *)(ulong)uVar3,msglen);
  ikm.len = in_RDX;
  ikm.base = (uint8_t *)in_RDI;
  local_4 = key_schedule_extract(in_RSI,ikm);
  if ((local_4 != 0) ||
     (local_4 = setup_traffic_protection
                          (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                           (char *)in_stack_ffffffffffffff98,(size_t)in_stack_ffffffffffffff90,
                           in_stack_ffffffffffffff8c), local_4 != 0)) goto LAB_001199e2;
  if ((*(byte *)(in_RDI + 0x34) >> 1 & 1) == 0) {
    local_4 = setup_traffic_protection
                        (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                         (char *)in_stack_ffffffffffffff98,(size_t)in_stack_ffffffffffffff90,
                         in_stack_ffffffffffffff8c);
joined_r0x001199c5:
    if (local_4 != 0) goto LAB_001199e2;
  }
  else {
    pvVar2 = malloc(0x40);
    in_RDI[0x3e] = (long)pvVar2;
    if (pvVar2 == (void *)0x0) {
      local_4 = 0x201;
      goto LAB_001199e2;
    }
    local_4 = derive_secret((ptls_key_schedule_t *)
                            CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                            in_stack_ffffffffffffffa8,
                            (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    if (local_4 != 0) goto LAB_001199e2;
    if (*(long *)(*in_RDI + 0x98) != 0) {
      local_4 = (*(code *)**(undefined8 **)(*in_RDI + 0x98))
                          (*(undefined8 *)(*in_RDI + 0x98),in_RDI,1,2,in_RDI[0x3e]);
      goto joined_r0x001199c5;
    }
  }
  *(undefined4 *)(in_RDI + 1) = 3;
  local_4 = 0x202;
LAB_001199e2:
  if (in_stack_ffffffffffffff70 != (ptls_key_schedule_t *)0x0) {
    (*ptls_clear_memory)(in_stack_ffffffffffffff70,local_88);
    free(in_stack_ffffffffffffff70);
  }
  return local_4;
}

Assistant:

static int client_handle_hello(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_iovec_t message,
                               ptls_handshake_properties_t *properties)
{
    struct st_ptls_server_hello_t sh;
    ptls_iovec_t ecdh_secret = {NULL};
    int ret;

    if ((ret = decode_server_hello(tls, &sh, message.base + PTLS_HANDSHAKE_HEADER_SIZE, message.base + message.len)) != 0)
        goto Exit;
    if (!(sh.legacy_session_id.len == tls->client.legacy_session_id.len &&
          ptls_mem_equal(sh.legacy_session_id.base, tls->client.legacy_session_id.base, tls->client.legacy_session_id.len))) {
        ret = PTLS_ALERT_ILLEGAL_PARAMETER;
        goto Exit;
    }

    if (sh.is_retry_request) {
        if ((ret = key_schedule_select_one(tls->key_schedule, tls->cipher_suite, 0)) != 0)
            goto Exit;
        return handle_hello_retry_request(tls, emitter, &sh, message, properties);
    }

    if ((ret = key_schedule_select_one(tls->key_schedule, tls->cipher_suite, tls->client.offered_psk && !tls->is_psk_handshake)) !=
        0)
        goto Exit;

    if (sh.peerkey.base != NULL) {
        if ((ret = tls->client.key_share_ctx->on_exchange(&tls->client.key_share_ctx, 1, &ecdh_secret, sh.peerkey)) != 0)
            goto Exit;
    }

    ptls__key_schedule_update_hash(tls->key_schedule, message.base, message.len);

    if ((ret = key_schedule_extract(tls->key_schedule, ecdh_secret)) != 0)
        goto Exit;
    if ((ret = setup_traffic_protection(tls, 0, "s hs traffic", 2, 0)) != 0)
        goto Exit;
    if (tls->client.using_early_data) {
        if ((tls->pending_handshake_secret = malloc(PTLS_MAX_DIGEST_SIZE)) == NULL) {
            ret = PTLS_ERROR_NO_MEMORY;
            goto Exit;
        }
        if ((ret = derive_secret(tls->key_schedule, tls->pending_handshake_secret, "c hs traffic")) != 0)
            goto Exit;
        if (tls->ctx->update_traffic_key != NULL &&
            (ret = tls->ctx->update_traffic_key->cb(tls->ctx->update_traffic_key, tls, 1, 2, tls->pending_handshake_secret)) != 0)
            goto Exit;
    } else {
        if ((ret = setup_traffic_protection(tls, 1, "c hs traffic", 2, 0)) != 0)
            goto Exit;
    }

    tls->state = PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS;
    ret = PTLS_ERROR_IN_PROGRESS;

Exit:
    if (ecdh_secret.base != NULL) {
        ptls_clear_memory(ecdh_secret.base, ecdh_secret.len);
        free(ecdh_secret.base);
    }
    return ret;
}